

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int ext_opsize(int ext,int pos)

{
  byte local_14;
  int pos_local;
  int ext_local;
  
  local_14 = (byte)pos;
  switch(ext >> (local_14 & 0x1f) & 7) {
  case 0:
    pos_local = 2;
    break;
  case 1:
    pos_local = 3;
    break;
  case 2:
    pos_local = 5;
    break;
  case 3:
    pos_local = 6;
    break;
  case 4:
    pos_local = 1;
    break;
  case 5:
    pos_local = 4;
    break;
  case 6:
    pos_local = 0;
    break;
  default:
    pos_local = 0;
  }
  return pos_local;
}

Assistant:

static inline int ext_opsize(int ext, int pos)
{
    switch ((ext >> pos) & 7) {
    case 0: return OS_LONG;
    case 1: return OS_SINGLE;
    case 2: return OS_EXTENDED;
    case 3: return OS_PACKED;
    case 4: return OS_WORD;
    case 5: return OS_DOUBLE;
    case 6: return OS_BYTE;
    default:
        // g_assert_not_reached();
        return 0;
    }
}